

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::test4000SmallCells(Test *this)

{
  int iVar1;
  Data *pDVar2;
  QRect *pQVar3;
  const_iterator expectedBegin;
  QTextStream *this_00;
  qsizetype qVar4;
  char cVar5;
  bool bVar6;
  TableBreakingPageOrder TVar7;
  int iVar8;
  AutoTableElement *pAVar9;
  reference pQVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QArrayDataPointer<QRect> local_118;
  char *local_100;
  QArrayDataPointer<QRect> local_f8;
  uint local_dc;
  Report report;
  QRect local_c0;
  QFont font;
  AutoTableElement tableElement;
  storage_type *local_80;
  int local_78;
  int iStack_74;
  QRect local_70;
  QRect local_60;
  QRect local_50;
  QRect local_40;
  
  fillModel(this,0x28,100,true);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar9 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar9);
  local_f8.d._0_4_ = 0;
  local_f8.d._4_4_ = 0;
  local_f8.ptr._0_4_ = 0;
  local_f8.ptr._4_4_ = 0;
  local_f8.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_80,"Arial",5);
  QVar15.m_data = local_80;
  QVar15.m_size = (qsizetype)&local_118;
  QString::fromLatin1(QVar15);
  qVar4 = local_f8.size;
  pDVar2 = (Data *)CONCAT44(local_f8.d._4_4_,(int)local_f8.d);
  local_f8.d._0_4_ = (int)local_118.d;
  local_f8.d._4_4_ = (uint)((ulong)local_118.d >> 0x20);
  pQVar3 = (QRect *)CONCAT44(local_f8.ptr._4_4_,(int)local_f8.ptr);
  local_f8.ptr._0_4_ = (int)local_118.ptr;
  local_f8.ptr._4_4_ = (int)((ulong)local_118.ptr >> 0x20);
  local_f8.size = local_118.size;
  local_118.size = qVar4;
  local_118.d = pDVar2;
  local_118.ptr = pQVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
  QFont::QFont(&font,(QString *)&local_f8,-1,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QFont::setPixelSize((int)&font);
  KDReports::Report::setDefaultFont((QFont *)&report);
  KDReports::Report::scaleTo((int)&report,2);
  TVar7 = KDReports::Report::mainTable();
  KDReports::MainTable::setTableBreakingPageOrder(TVar7);
  iVar8 = KDReports::Report::numberOfPages();
  cVar5 = QTest::qCompare(iVar8,6,"report.numberOfPages()","6",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                          ,0x136);
  if (cVar5 != '\0') {
    local_118.d = (Data *)0x13a00000002;
    local_118.ptr = (QRect *)0x10c720;
    local_118.size = 0x10d281;
    local_100 = "default";
    QMessageLogger::debug();
    KDReports::Report::mainTable();
    dVar14 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    QTextStream::operator<<((QTextStream *)CONCAT44(local_f8.d._4_4_,(int)local_f8.d),dVar14);
    if (((QTextStream *)CONCAT44(local_f8.d._4_4_,(int)local_f8.d))[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)CONCAT44(local_f8.d._4_4_,(int)local_f8.d),' ');
    }
    QDebug::~QDebug((QDebug *)&local_f8);
    KDReports::Report::mainTable();
    dVar14 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    cVar5 = QTest::qVerify(0.45 <= dVar14,"report.mainTable()->lastAutoFontScalingFactor() >= 0.45",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x141);
    if (cVar5 != '\0') {
      KDReports::Report::mainTable();
      dVar14 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
      cVar5 = QTest::qVerify(dVar14 <= 0.5,"report.mainTable()->lastAutoFontScalingFactor() <= 0.50"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x142);
      if (cVar5 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,0);
        iVar8 = pQVar10->y2 - pQVar10->y1;
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
        local_118.d = (Data *)0x14500000002;
        local_118.ptr = (QRect *)0x10c720;
        local_118.size = 0x10d281;
        local_100 = "default";
        QMessageLogger::debug();
        uVar11 = iVar8 + 1;
        QTextStream::operator<<((QTextStream *)CONCAT44(local_c0.y1,local_c0.x1),uVar11);
        if (((QTextStream *)CONCAT44(local_c0.y1,local_c0.x1))[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)CONCAT44(local_c0.y1,local_c0.x1),' ');
        }
        local_70._0_8_ = "rows";
        this_00 = (QTextStream *)CONCAT44(local_c0.y1,local_c0.x1);
        QByteArrayView::QByteArrayView<const_char_*,_true>
                  ((QByteArrayView *)&local_80,(char **)&local_70);
        QVar16.m_data = local_80;
        QVar16.m_size = (qsizetype)&local_f8;
        QString::fromUtf8(QVar16);
        QTextStream::operator<<(this_00,(QString *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        if (((QTextStream *)CONCAT44(local_c0.y1,local_c0.x1))[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)CONCAT44(local_c0.y1,local_c0.x1),' ');
        }
        QDebug::~QDebug((QDebug *)&local_c0);
        cVar5 = QTest::qVerify(0x24 < (int)uVar11,"rows >= 37","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x146);
        if (cVar5 != '\0') {
          cVar5 = QTest::qVerify((int)uVar11 < 0x31,"rows <= 48","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x147);
          if (cVar5 != '\0') {
            KDReports::Report::mainTable();
            KDReports::MainTable::pageRects();
            pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,0);
            iVar12 = pQVar10->x2 - pQVar10->x1;
            iVar13 = iVar12 + 1;
            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
            cVar5 = QTest::qVerify(0x13 < iVar13,"columns >= 20","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x149);
            if (cVar5 != '\0') {
              cVar5 = QTest::qVerify(iVar13 < 0x16,"columns <= 21","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x14a);
              if (cVar5 != '\0') {
                KDReports::Report::mainTable();
                KDReports::MainTable::pageRects();
                pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,0);
                local_f8.d._0_4_ = 0;
                local_f8.d._4_4_ = 0;
                local_f8.ptr._0_4_ = iVar12;
                local_f8.ptr._4_4_ = iVar8;
                bVar6 = QTest::qCompare<QRect,QRect>
                                  (pQVar10,(QRect *)&local_f8,"report.mainTable()->pageRects()[0]",
                                   "QRect(0, 0, columns, rows)",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x14d);
                QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                if (bVar6) {
                  KDReports::Report::mainTable();
                  KDReports::MainTable::pageRects();
                  pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,1);
                  local_f8.d._4_4_ = 0;
                  local_f8.ptr._0_4_ = 0x27;
                  local_f8.d._0_4_ = iVar13;
                  local_f8.ptr._4_4_ = iVar8;
                  bVar6 = QTest::qCompare<QRect,QRect>
                                    (pQVar10,(QRect *)&local_f8,"report.mainTable()->pageRects()[1]"
                                     ,"QRect(columns, 0, 40 - columns, rows)",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x14e);
                  QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                  if (bVar6) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,2);
                    local_f8.d._0_4_ = 0;
                    iVar1 = iVar8 + uVar11;
                    local_f8.d._4_4_ = uVar11;
                    local_f8.ptr._0_4_ = iVar12;
                    local_f8.ptr._4_4_ = iVar1;
                    bVar6 = QTest::qCompare<QRect,QRect>
                                      (pQVar10,(QRect *)&local_f8,
                                       "report.mainTable()->pageRects()[2]",
                                       "QRect(0, rows, columns, rows)",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0x14f);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                    if (bVar6) {
                      KDReports::Report::mainTable();
                      KDReports::MainTable::pageRects();
                      pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,3);
                      local_f8.ptr._0_4_ = 0x27;
                      local_f8.d._0_4_ = iVar13;
                      local_f8.d._4_4_ = uVar11;
                      local_f8.ptr._4_4_ = iVar1;
                      bVar6 = QTest::qCompare<QRect,QRect>
                                        (pQVar10,(QRect *)&local_f8,
                                         "report.mainTable()->pageRects()[3]",
                                         "QRect(columns, rows, 40 - columns, rows)",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                         ,0x150);
                      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                      if (bVar6) {
                        KDReports::Report::mainTable();
                        KDReports::MainTable::pageRects();
                        pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,4);
                        local_f8.d._4_4_ = uVar11 * 2;
                        local_f8.d._0_4_ = 0;
                        local_f8.ptr._4_4_ = 99;
                        local_f8.ptr._0_4_ = iVar12;
                        local_dc = local_f8.d._4_4_;
                        bVar6 = QTest::qCompare<QRect,QRect>
                                          (pQVar10,(QRect *)&local_f8,
                                           "report.mainTable()->pageRects()[4]",
                                           "QRect(0, 2 * rows, columns, 100 - 2 * rows)",
                                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                           ,0x151);
                        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                        if (bVar6) {
                          KDReports::Report::mainTable();
                          KDReports::MainTable::pageRects();
                          pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_118,5);
                          local_f8.d._4_4_ = local_dc;
                          local_f8.ptr._0_4_ = 0x27;
                          local_f8.ptr._4_4_ = 99;
                          local_f8.d._0_4_ = iVar13;
                          bVar6 = QTest::qCompare<QRect,QRect>
                                            (pQVar10,(QRect *)&local_f8,
                                             "report.mainTable()->pageRects()[5]",
                                             "QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows)"
                                             ,
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                             ,0x152);
                          QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                          if (bVar6) {
                            KDReports::Report::setTableBreakingPageOrder
                                      ((TableBreakingPageOrder)&report);
                            KDReports::Report::mainTable();
                            KDReports::MainTable::pageRects();
                            local_f8.d._0_4_ = 0;
                            local_f8.d._4_4_ = 0;
                            local_f8.ptr._0_4_ = 0;
                            local_f8.ptr._4_4_ = 0;
                            local_f8.size = 0;
                            local_80 = (storage_type *)0x0;
                            local_78 = iVar12;
                            iStack_74 = iVar8;
                            QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                                      ((QMovableArrayOps<QRect> *)&local_f8,0,(QRect *)&local_80);
                            local_70._0_8_ = (ulong)uVar11 << 0x20;
                            local_70.x2 = iVar12;
                            local_70.y2 = iVar1;
                            QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                                      ((QMovableArrayOps<QRect> *)&local_f8,local_f8.size,&local_70)
                            ;
                            local_c0.x1 = 0;
                            local_c0.y1 = local_dc;
                            local_c0.y2 = 99;
                            local_c0.x2 = iVar12;
                            QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                                      ((QMovableArrayOps<QRect> *)&local_f8,local_f8.size,&local_c0)
                            ;
                            local_40.y1 = 0;
                            local_40.x2 = 0x27;
                            local_40.x1 = iVar13;
                            local_40.y2 = iVar8;
                            QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                                      ((QMovableArrayOps<QRect> *)&local_f8,local_f8.size,&local_40)
                            ;
                            local_50.x2 = 0x27;
                            local_50.x1 = iVar13;
                            local_50.y1 = uVar11;
                            local_50.y2 = iVar1;
                            QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                                      ((QMovableArrayOps<QRect> *)&local_f8,local_f8.size,&local_50)
                            ;
                            local_60.y1 = local_dc;
                            local_60.x2 = 0x27;
                            local_60.y2 = 99;
                            local_60.x1 = iVar13;
                            QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                                      ((QMovableArrayOps<QRect> *)&local_f8,local_f8.size,&local_60)
                            ;
                            expectedBegin.i._4_4_ = local_f8.ptr._4_4_;
                            expectedBegin.i._0_4_ = (int)local_f8.ptr;
                            QTest::
                            _q_compareSequence<QList<QRect>::const_iterator,QList<QRect>::const_iterator>
                                      ((const_iterator)local_118.ptr,local_118.ptr + local_118.size,
                                       expectedBegin,expectedBegin.i + local_f8.size,
                                       "report.mainTable()->pageRects()",
                                       "QList<QRect>() << QRect(0, 0, columns, rows) << QRect(0, rows, columns, rows) << QRect(0, 2 * rows, columns, 100 - 2 * rows) << QRect(columns, 0, 40 - columns, rows) << QRect(columns, rows, 40 - columns, rows) << QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows)"
                                       ,
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0x158);
                            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_f8);
                            QArrayDataPointer<QRect>::~QArrayDataPointer(&local_118);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QFont::~QFont(&font);
  KDReports::AutoTableElement::~AutoTableElement(&tableElement);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void test4000SmallCells()
    {
        fillModel(40, 100, true /*small cells*/);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(false);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        QFont font(QLatin1String("Arial"));
        font.setPixelSize(19);
        report.setDefaultFont(font);
        report.scaleTo(2, 50);
        report.mainTable()->setTableBreakingPageOrder(Report::RightThenDown);
        QCOMPARE(report.numberOfPages(), 6);
        // With point size 10, initially I was getting 0.583037. With FontScaler: 0.524504.
        // With pixel sizes: 0.478, on both machines.
        // Autobuild on linux gets 37 rows instead of 43, though (taller font, by one pixel...)
        qDebug() << report.mainTable()->lastAutoFontScalingFactor();
#ifdef Q_OS_MAC
        // Bah, fonts change too much.
        return;
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() >= 0.37);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() <= 0.39);
#else
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() >= 0.45);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() <= 0.50);
#endif
        const int rows = report.mainTable()->pageRects()[0].height();
        qDebug() << rows << "rows";
        QVERIFY(rows >= 37);
        QVERIFY(rows <= 48);
        const int columns = report.mainTable()->pageRects()[0].width();
        QVERIFY(columns >= 20);
        QVERIFY(columns <= 21);

        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(columns, 0, 40 - columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[2], QRect(0, rows, columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[3], QRect(columns, rows, 40 - columns, rows));
        QCOMPARE(report.mainTable()->pageRects()[4], QRect(0, 2 * rows, columns, 100 - 2 * rows));
        QCOMPARE(report.mainTable()->pageRects()[5], QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows));

        report.setTableBreakingPageOrder(Report::DownThenRight);
        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects(),
                 QList<QRect>() << QRect(0, 0, columns, rows) << QRect(0, rows, columns, rows) << QRect(0, 2 * rows, columns, 100 - 2 * rows) << QRect(columns, 0, 40 - columns, rows)
                                << QRect(columns, rows, 40 - columns, rows) << QRect(columns, 2 * rows, 40 - columns, 100 - 2 * rows));
    }